

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::beckmann::ndf_std_radial(beckmann *this,float_t zm)

{
  float fVar1;
  float_t fVar2;
  double dVar3;
  float local_24;
  float local_20;
  float_t local_1c;
  float_t rm_sqr;
  float_t zm_local;
  beckmann *this_local;
  
  if (zm <= 0.0) {
    this_local._4_4_ = 0.0;
  }
  else {
    local_1c = zm;
    _rm_sqr = this;
    fVar1 = sqr<float>(&local_1c);
    local_20 = 1.0 / fVar1 - 1.0;
    dVar3 = std::exp((double)(ulong)(uint)-local_20);
    local_24 = sqr<float>(&local_1c);
    fVar1 = sqr<float>(&local_24);
    fVar2 = m_pi();
    this_local._4_4_ = SUB84(dVar3,0) / (fVar1 * fVar2);
  }
  return this_local._4_4_;
}

Assistant:

float_t beckmann::ndf_std_radial(float_t zm) const
{
	if (zm > 0) {
		float_t rm_sqr = 1 / sqr(zm) - 1;
		return exp(-rm_sqr) / (sqr(sqr(zm)) * m_pi());
	}
	return 0;
}